

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void DrawTextureNPatch(Texture2D texture,NPatchInfo nPatchInfo,Rectangle dest,Vector2 origin,
                      float rotation,Color tint)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float x;
  float x_00;
  float y;
  float fVar6;
  float fVar7;
  float fVar8;
  float y_00;
  float x_01;
  float y_01;
  float fVar9;
  float y_02;
  float y_03;
  float local_88;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float local_34;
  
  if (texture.id == 0) {
    return;
  }
  fVar7 = 0.0;
  if (0 < (int)dest.width) {
    fVar7 = dest.width;
  }
  fVar6 = 0.0;
  if (0 < (int)dest.height) {
    fVar6 = dest.height;
  }
  if (nPatchInfo.source.width < 0.0) {
    nPatchInfo.source.x = nPatchInfo.source.x - nPatchInfo.source.width;
  }
  if (nPatchInfo.source.height < 0.0) {
    nPatchInfo.source.y = nPatchInfo.source.y - nPatchInfo.source.height;
  }
  bVar2 = nPatchInfo.layout == 2;
  y_00 = nPatchInfo.source.height;
  if (!bVar2) {
    y_00 = fVar6;
  }
  bVar3 = nPatchInfo.layout == 1;
  fVar6 = nPatchInfo.source.width;
  if (!bVar3) {
    fVar6 = fVar7;
  }
  fVar7 = (float)nPatchInfo.left;
  local_88 = (float)nPatchInfo.top;
  fVar9 = (float)nPatchInfo.right;
  local_34 = (float)nPatchInfo.bottom;
  bVar1 = fVar7 + fVar9 < fVar6;
  if (!bVar3 && !bVar1) {
    fVar7 = (fVar7 / (fVar7 + fVar9)) * fVar6;
    fVar9 = fVar6 - fVar7;
  }
  fVar4 = (float)texture.width;
  fVar8 = (float)texture.height;
  fVar5 = local_88 + local_34;
  if (!bVar2 && fVar5 >= y_00) {
    local_88 = (local_88 / fVar5) * y_00;
    local_34 = y_00 - local_88;
  }
  rlSetTexture(texture.id);
  rlPushMatrix();
  local_58 = dest.x;
  fStack_54 = dest.y;
  rlTranslatef(local_58,fStack_54,0.0);
  rlRotatef(rotation,0.0,0.0,1.0);
  local_48 = origin.x;
  fStack_44 = origin.y;
  rlTranslatef(-local_48,-fStack_44,0.0);
  rlBegin(7);
  rlColor4ub(tint.r,tint.g,tint.b,tint.a);
  rlNormal3f(0.0,0.0,1.0);
  x = fVar6 - fVar9;
  x_00 = nPatchInfo.source.x / fVar4;
  y_03 = nPatchInfo.source.y / fVar8;
  x_01 = (nPatchInfo.source.x + fVar7) / fVar4;
  fVar9 = ((nPatchInfo.source.width + nPatchInfo.source.x) - fVar9) / fVar4;
  fVar4 = (nPatchInfo.source.width + nPatchInfo.source.x) / fVar4;
  y = (nPatchInfo.source.height + nPatchInfo.source.y) / fVar8;
  if (nPatchInfo.layout == 2) {
    rlTexCoord2f(x_00,y);
    rlVertex2f(0.0,y_00);
    rlTexCoord2f(x_01,y);
    rlVertex2f(fVar7,y_00);
    rlTexCoord2f(x_01,y_03);
    rlVertex2f(fVar7,0.0);
    rlTexCoord2f(x_00,y_03);
    rlVertex2f(0.0,0.0);
    if (bVar3 || bVar1) {
      rlTexCoord2f(x_01,y);
      rlVertex2f(fVar7,y_00);
      rlTexCoord2f(fVar9,y);
      rlVertex2f(x,y_00);
      rlTexCoord2f(fVar9,y_03);
      rlVertex2f(x,0.0);
      rlTexCoord2f(x_01,y_03);
      rlVertex2f(fVar7,0.0);
    }
    rlTexCoord2f(fVar9,y);
    rlVertex2f(x,y_00);
    rlTexCoord2f(fVar4,y);
    rlVertex2f(fVar6,y_00);
    rlTexCoord2f(fVar4,y_03);
    rlVertex2f(fVar6,0.0);
    rlTexCoord2f(fVar9,y_03);
    y_01 = 0.0;
  }
  else {
    y_01 = y_00 - local_34;
    y_02 = (nPatchInfo.source.y + local_88) / fVar8;
    fVar8 = ((nPatchInfo.source.height + nPatchInfo.source.y) - local_34) / fVar8;
    if (nPatchInfo.layout == 1) {
      rlTexCoord2f(x_00,y_02);
      rlVertex2f(0.0,local_88);
      rlTexCoord2f(fVar4,y_02);
      rlVertex2f(fVar6,local_88);
      rlTexCoord2f(fVar4,y_03);
      rlVertex2f(fVar6,0.0);
      rlTexCoord2f(x_00,y_03);
      rlVertex2f(0.0,0.0);
      if (bVar3 || bVar1) {
        rlTexCoord2f(x_00,fVar8);
        rlVertex2f(0.0,y_01);
        rlTexCoord2f(fVar4,fVar8);
        rlVertex2f(fVar6,y_01);
        rlTexCoord2f(fVar4,y_02);
        rlVertex2f(fVar6,local_88);
        rlTexCoord2f(x_00,y_02);
        rlVertex2f(0.0,local_88);
      }
      rlTexCoord2f(x_00,y);
      rlVertex2f(0.0,y_00);
      rlTexCoord2f(fVar4,y);
      rlVertex2f(fVar6,y_00);
      rlTexCoord2f(fVar4,fVar8);
      rlVertex2f(fVar6,y_01);
      rlTexCoord2f(x_00,fVar8);
      x = 0.0;
    }
    else {
      if (nPatchInfo.layout != 0) goto LAB_0019dfe6;
      rlTexCoord2f(x_00,y_02);
      rlVertex2f(0.0,local_88);
      rlTexCoord2f(x_01,y_02);
      rlVertex2f(fVar7,local_88);
      rlTexCoord2f(x_01,y_03);
      rlVertex2f(fVar7,0.0);
      rlTexCoord2f(x_00,y_03);
      rlVertex2f(0.0,0.0);
      if (bVar3 || bVar1) {
        rlTexCoord2f(x_01,y_02);
        rlVertex2f(fVar7,local_88);
        rlTexCoord2f(fVar9,y_02);
        rlVertex2f(x,local_88);
        rlTexCoord2f(fVar9,y_03);
        rlVertex2f(x,0.0);
        rlTexCoord2f(x_01,y_03);
        rlVertex2f(fVar7,0.0);
      }
      rlTexCoord2f(fVar9,y_02);
      rlVertex2f(x,local_88);
      rlTexCoord2f(fVar4,y_02);
      rlVertex2f(fVar6,local_88);
      rlTexCoord2f(fVar4,y_03);
      rlVertex2f(fVar6,0.0);
      rlTexCoord2f(fVar9,y_03);
      rlVertex2f(x,0.0);
      if (bVar2 || fVar5 < y_00) {
        rlTexCoord2f(x_00,fVar8);
        rlVertex2f(0.0,y_01);
        rlTexCoord2f(x_01,fVar8);
        rlVertex2f(fVar7,y_01);
        rlTexCoord2f(x_01,y_02);
        rlVertex2f(fVar7,local_88);
        rlTexCoord2f(x_00,y_02);
        rlVertex2f(0.0,local_88);
        if (bVar3 || bVar1) {
          rlTexCoord2f(x_01,fVar8);
          rlVertex2f(fVar7,y_01);
          rlTexCoord2f(fVar9,fVar8);
          rlVertex2f(x,y_01);
          rlTexCoord2f(fVar9,y_02);
          rlVertex2f(x,local_88);
          rlTexCoord2f(x_01,y_02);
          rlVertex2f(fVar7,local_88);
        }
        rlTexCoord2f(fVar9,fVar8);
        rlVertex2f(x,y_01);
        rlTexCoord2f(fVar4,fVar8);
        rlVertex2f(fVar6,y_01);
        rlTexCoord2f(fVar4,y_02);
        rlVertex2f(fVar6,local_88);
        rlTexCoord2f(fVar9,y_02);
        rlVertex2f(x,local_88);
      }
      rlTexCoord2f(x_00,y);
      rlVertex2f(0.0,y_00);
      rlTexCoord2f(x_01,y);
      rlVertex2f(fVar7,y_00);
      rlTexCoord2f(x_01,fVar8);
      rlVertex2f(fVar7,y_01);
      rlTexCoord2f(x_00,fVar8);
      rlVertex2f(0.0,y_01);
      if (bVar3 || bVar1) {
        rlTexCoord2f(x_01,y);
        rlVertex2f(fVar7,y_00);
        rlTexCoord2f(fVar9,y);
        rlVertex2f(x,y_00);
        rlTexCoord2f(fVar9,fVar8);
        rlVertex2f(x,y_01);
        rlTexCoord2f(x_01,fVar8);
        rlVertex2f(fVar7,y_01);
      }
      rlTexCoord2f(fVar9,y);
      rlVertex2f(x,y_00);
      rlTexCoord2f(fVar4,y);
      rlVertex2f(fVar6,y_00);
      rlTexCoord2f(fVar4,fVar8);
      rlVertex2f(fVar6,y_01);
      rlTexCoord2f(fVar9,fVar8);
    }
  }
  rlVertex2f(x,y_01);
LAB_0019dfe6:
  rlEnd();
  rlPopMatrix();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawTextureNPatch(Texture2D texture, NPatchInfo nPatchInfo, Rectangle dest, Vector2 origin, float rotation, Color tint)
{
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        float patchWidth = ((int)dest.width <= 0)? 0.0f : dest.width;
        float patchHeight = ((int)dest.height <= 0)? 0.0f : dest.height;

        if (nPatchInfo.source.width < 0) nPatchInfo.source.x -= nPatchInfo.source.width;
        if (nPatchInfo.source.height < 0) nPatchInfo.source.y -= nPatchInfo.source.height;
        if (nPatchInfo.layout == NPATCH_THREE_PATCH_HORIZONTAL) patchHeight = nPatchInfo.source.height;
        if (nPatchInfo.layout == NPATCH_THREE_PATCH_VERTICAL) patchWidth = nPatchInfo.source.width;

        bool drawCenter = true;
        bool drawMiddle = true;
        float leftBorder = (float)nPatchInfo.left;
        float topBorder = (float)nPatchInfo.top;
        float rightBorder = (float)nPatchInfo.right;
        float bottomBorder = (float)nPatchInfo.bottom;

        // Adjust the lateral (left and right) border widths in case patchWidth < texture.width
        if (patchWidth <= (leftBorder + rightBorder) && nPatchInfo.layout != NPATCH_THREE_PATCH_VERTICAL)
        {
            drawCenter = false;
            leftBorder = (leftBorder/(leftBorder + rightBorder))*patchWidth;
            rightBorder = patchWidth - leftBorder;
        }

        // Adjust the lateral (top and bottom) border heights in case patchHeight < texture.height
        if (patchHeight <= (topBorder + bottomBorder) && nPatchInfo.layout != NPATCH_THREE_PATCH_HORIZONTAL)
        {
            drawMiddle = false;
            topBorder = (topBorder/(topBorder + bottomBorder))*patchHeight;
            bottomBorder = patchHeight - topBorder;
        }

        Vector2 vertA, vertB, vertC, vertD;
        vertA.x = 0.0f;                             // outer left
        vertA.y = 0.0f;                             // outer top
        vertB.x = leftBorder;                       // inner left
        vertB.y = topBorder;                        // inner top
        vertC.x = patchWidth  - rightBorder;        // inner right
        vertC.y = patchHeight - bottomBorder;       // inner bottom
        vertD.x = patchWidth;                       // outer right
        vertD.y = patchHeight;                      // outer bottom

        Vector2 coordA, coordB, coordC, coordD;
        coordA.x = nPatchInfo.source.x/width;
        coordA.y = nPatchInfo.source.y/height;
        coordB.x = (nPatchInfo.source.x + leftBorder)/width;
        coordB.y = (nPatchInfo.source.y + topBorder)/height;
        coordC.x = (nPatchInfo.source.x + nPatchInfo.source.width  - rightBorder)/width;
        coordC.y = (nPatchInfo.source.y + nPatchInfo.source.height - bottomBorder)/height;
        coordD.x = (nPatchInfo.source.x + nPatchInfo.source.width)/width;
        coordD.y = (nPatchInfo.source.y + nPatchInfo.source.height)/height;

        rlSetTexture(texture.id);

        rlPushMatrix();
            rlTranslatef(dest.x, dest.y, 0.0f);
            rlRotatef(rotation, 0.0f, 0.0f, 1.0f);
            rlTranslatef(-origin.x, -origin.y, 0.0f);

            rlBegin(RL_QUADS);
                rlColor4ub(tint.r, tint.g, tint.b, tint.a);
                rlNormal3f(0.0f, 0.0f, 1.0f);               // Normal vector pointing towards viewer

                if (nPatchInfo.layout == NPATCH_NINE_PATCH)
                {
                    // ------------------------------------------------------------
                    // TOP-LEFT QUAD
                    rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // TOP-CENTER QUAD
                        rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-left corner for texture and quad
                    }
                    // TOP-RIGHT QUAD
                    rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawMiddle)
                    {
                        // ------------------------------------------------------------
                        // MIDDLE-LEFT QUAD
                        rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Top-left corner for texture and quad
                        if (drawCenter)
                        {
                            // MIDDLE-CENTER QUAD
                            rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Bottom-left corner for texture and quad
                            rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Bottom-right corner for texture and quad
                            rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Top-right corner for texture and quad
                            rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Top-left corner for texture and quad
                        }

                        // MIDDLE-RIGHT QUAD
                        rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Top-left corner for texture and quad
                    }

                    // ------------------------------------------------------------
                    // BOTTOM-LEFT QUAD
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // BOTTOM-CENTER QUAD
                        rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Top-left corner for texture and quad
                    }

                    // BOTTOM-RIGHT QUAD
                    rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Top-left corner for texture and quad
                }
                else if (nPatchInfo.layout == NPATCH_THREE_PATCH_VERTICAL)
                {
                    // TOP QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // MIDDLE QUAD
                        // -----------------------------------------------------------
                        // Texture coords                 Vertices
                        rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Top-left corner for texture and quad
                    }
                    // BOTTOM QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Top-left corner for texture and quad
                }
                else if (nPatchInfo.layout == NPATCH_THREE_PATCH_HORIZONTAL)
                {
                    // LEFT QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // CENTER QUAD
                        // -----------------------------------------------------------
                        // Texture coords                 Vertices
                        rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-left corner for texture and quad
                    }
                    // RIGHT QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-left corner for texture and quad
                }
            rlEnd();
        rlPopMatrix();

        rlSetTexture(0);
    }
}